

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  long lVar1;
  
  memset(this->KeysDown,0,0x28c);
  lVar1 = 0xe18;
  do {
    *(undefined1 *)((long)this + lVar1 + -4) = 0;
    *(undefined8 *)((long)&this->ConfigFlags + lVar1) = 0xbf800000bf800000;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x36d8);
  this->KeyCtrl = false;
  this->KeyShift = false;
  this->KeyAlt = false;
  this->KeySuper = false;
  this->KeyMods = 0;
  (this->MousePos).x = -3.4028235e+38;
  (this->MousePos).y = -3.4028235e+38;
  this->MouseDown[0] = false;
  this->MouseDown[1] = false;
  this->MouseDown[2] = false;
  this->MouseDown[3] = false;
  this->MouseDown[4] = false;
  lVar1 = -5;
  do {
    this->MouseDragMaxDistanceSqr[lVar1] = -1.0;
    this->MouseDownDurationPrev[lVar1] = -1.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  this->MouseWheel = 0.0;
  this->MouseWheelH = 0.0;
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    memset(KeysDown, 0, sizeof(KeysDown));
#endif
    for (int n = 0; n < IM_ARRAYSIZE(KeysData); n++)
    {
        KeysData[n].Down             = false;
        KeysData[n].DownDuration     = -1.0f;
        KeysData[n].DownDurationPrev = -1.0f;
    }
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = ImGuiMod_None;
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    for (int n = 0; n < IM_ARRAYSIZE(MouseDown); n++)
    {
        MouseDown[n] = false;
        MouseDownDuration[n] = MouseDownDurationPrev[n] = -1.0f;
    }
    MouseWheel = MouseWheelH = 0.0f;
}